

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int growVTrans(sqlite3 *db)

{
  VTable **ppVVar1;
  int nBytes;
  VTable **aVTrans;
  int ARRAY_INCR;
  sqlite3 *db_local;
  
  if (db->nVTrans % 5 == 0) {
    ppVVar1 = (VTable **)sqlite3DbRealloc(db,db->aVTrans,(long)((db->nVTrans + 5) * 8));
    if (ppVVar1 == (VTable **)0x0) {
      return 7;
    }
    memset(ppVVar1 + db->nVTrans,0,0x28);
    db->aVTrans = ppVVar1;
  }
  return 0;
}

Assistant:

static int growVTrans(sqlite3 *db){
  const int ARRAY_INCR = 5;

  /* Grow the sqlite3.aVTrans array if required */
  if( (db->nVTrans%ARRAY_INCR)==0 ){
    VTable **aVTrans;
    int nBytes = sizeof(sqlite3_vtab *) * (db->nVTrans + ARRAY_INCR);
    aVTrans = sqlite3DbRealloc(db, (void *)db->aVTrans, nBytes);
    if( !aVTrans ){
      return SQLITE_NOMEM_BKPT;
    }
    memset(&aVTrans[db->nVTrans], 0, sizeof(sqlite3_vtab *)*ARRAY_INCR);
    db->aVTrans = aVTrans;
  }

  return SQLITE_OK;
}